

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsChannelType.h
# Opt level: O1

void __thiscall
KDIS::PDU::Intercom_Control_PDU::SetCommunicationsChannelType
          (Intercom_Control_PDU *this,CommunicationsChannelType *CCT)

{
  (this->m_CommChannelType).field_0 = CCT->field_0;
  return;
}

Assistant:

class KDIS_EXPORT CommunicationsChannelType : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT8 m_ui8Type  : 7;
            KUINT8 m_ui8Class : 1;
        };

        KUINT8 m_ui8CommChannelType;
    };

public:

	static const KUINT16 COMM_CHANNEL_TYPE_SIZE = 1;

    CommunicationsChannelType();

    CommunicationsChannelType(KDataStream &stream) noexcept(false);

    CommunicationsChannelType( KDIS::DATA_TYPE::ENUMS::ChannelType CT, KDIS::DATA_TYPE::ENUMS::ChannelClass CC );

    virtual ~CommunicationsChannelType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::CommunicationsChannelType::SetType
    //              KDIS::DATA_TYPE::CommunicationsChannelType::GetType
    // Description: Type of channel.
    // Parameter:   ChannelType CT, void
    //************************************
    void SetType( KDIS::DATA_TYPE::ENUMS::ChannelType CT );
    KDIS::DATA_TYPE::ENUMS::ChannelType GetType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CommunicationsChannelType::SetClass
    //              KDIS::DATA_TYPE::CommunicationsChannelType::GetClass
    // Description: Communications class.
    // Parameter:   ChannelClass CC, void
    //************************************
    void SetClass( KDIS::DATA_TYPE::ENUMS::ChannelClass CC );
    KDIS::DATA_TYPE::ENUMS::ChannelClass GetClass() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CommunicationsChannelType::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CommunicationsChannelType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::CommunicationsChannelType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const CommunicationsChannelType & Value ) const;
    KBOOL operator != ( const CommunicationsChannelType & Value ) const;
}